

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void handleEvents(double *timeout)

{
  _GLFWcursor *p_Var1;
  wl_cursor *pwVar2;
  bool bVar3;
  int iVar4;
  GLFWbool GVar5;
  ssize_t sVar6;
  _GLFWwindow *p_Var7;
  uint64_t uVar8;
  pollfd fds [4];
  uint64_t repeats;
  
  if (_glfw.joysticksInitialized != 0) {
    _glfwDetectJoystickConnectionLinux();
  }
  fds[0].fd = (*_glfw.wl.client.display_get_fd)(_glfw.wl.display);
  fds[0].events = 1;
  fds[0].revents = 0;
  fds[1].fd = _glfw.wl.keyRepeatTimerfd;
  fds[2].fd = _glfw.wl.cursorTimerfd;
  fds[2].events = 1;
  fds[2].revents = 0;
  fds[3].fd = -1;
  fds[1]._4_4_ = fds[0]._4_4_;
  fds[3]._4_4_ = fds[0]._4_4_;
  if (_glfw.wl.libdecor.context != (libdecor *)0x0) {
    iVar4 = (*_glfw.wl.libdecor.libdecor_get_fd_)(_glfw.wl.libdecor.context);
    fds[3].fd = iVar4;
  }
  bVar3 = false;
LAB_00124cec:
  if (!bVar3) {
    while (iVar4 = (*_glfw.wl.client.display_prepare_read)(_glfw.wl.display), iVar4 != 0) {
      iVar4 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
      if (0 < iVar4) {
        return;
      }
    }
    GVar5 = flushDisplay();
    if (GVar5 != 0) {
      GVar5 = _glfwPollPOSIX(fds,4,timeout);
      if (GVar5 == 0) {
        (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
        return;
      }
      if ((fds[0]._4_4_ & 0x10000) == 0) {
        (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
        bVar3 = false;
      }
      else {
        (*_glfw.wl.client.display_read_events)(_glfw.wl.display);
        iVar4 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
        bVar3 = 0 < iVar4;
      }
      if (((fds[1]._4_4_ & 0x10000) != 0) &&
         (sVar6 = read(_glfw.wl.keyRepeatTimerfd,&repeats,8), uVar8 = repeats, sVar6 == 8)) {
        while (uVar8 != 0) {
          iVar4 = -1;
          if ((ulong)(uint)_glfw.wl.keyRepeatScancode < 0x100) {
            iVar4 = (int)_glfw.wl.keycodes[(uint)_glfw.wl.keyRepeatScancode];
          }
          _glfwInputKey(_glfw.wl.keyboardFocus,iVar4,_glfw.wl.keyRepeatScancode,1,
                        _glfw.wl.xkb.modifiers);
          inputText(_glfw.wl.keyboardFocus,_glfw.wl.keyRepeatScancode);
          uVar8 = uVar8 - 1;
        }
        bVar3 = true;
      }
      if ((((((fds._20_8_ & 0x10000) != 0) &&
            (sVar6 = read(_glfw.wl.cursorTimerfd,&repeats,8), p_Var7 = _glfw.wl.pointerFocus,
            sVar6 == 8)) && (_glfw.wl.pointerFocus != (_GLFWwindow *)0x0)) &&
          ((((_glfw.wl.pointerFocus)->wl).hovered != 0 &&
           (p_Var1 = ((_glfw.wl.pointerFocus)->wl).currentCursor, p_Var1 != (_GLFWcursor *)0x0))))
         && (pwVar2 = (p_Var1->wl).cursor, pwVar2 != (wl_cursor *)0x0)) {
        (p_Var1->wl).currentImage = ((p_Var1->wl).currentImage + 1U) % pwVar2->image_count;
        setCursorImage(p_Var7,&p_Var1->wl);
      }
      if (((fds[3]._4_4_ & 0x10000) != 0) &&
         (iVar4 = (*_glfw.wl.libdecor.libdecor_dispatch_)(_glfw.wl.libdecor.context,0), 0 < iVar4))
      {
        bVar3 = true;
      }
      goto LAB_00124cec;
    }
    (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
    p_Var7 = (_GLFWwindow *)&_glfw.windowListHead;
    while (p_Var7 = p_Var7->next, p_Var7 != (_GLFWwindow *)0x0) {
      _glfwInputWindowCloseRequest(p_Var7);
    }
  }
  return;
}

Assistant:

static void handleEvents(double* timeout)
{
#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        _glfwDetectJoystickConnectionLinux();
#endif

    GLFWbool event = GLFW_FALSE;
    enum { DISPLAY_FD, KEYREPEAT_FD, CURSOR_FD, LIBDECOR_FD };
    struct pollfd fds[] =
    {
        [DISPLAY_FD] = { wl_display_get_fd(_glfw.wl.display), POLLIN },
        [KEYREPEAT_FD] = { _glfw.wl.keyRepeatTimerfd, POLLIN },
        [CURSOR_FD] = { _glfw.wl.cursorTimerfd, POLLIN },
        [LIBDECOR_FD] = { -1, POLLIN }
    };

    if (_glfw.wl.libdecor.context)
        fds[LIBDECOR_FD].fd = libdecor_get_fd(_glfw.wl.libdecor.context);

    while (!event)
    {
        while (wl_display_prepare_read(_glfw.wl.display) != 0)
        {
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                return;
        }

        // If an error other than EAGAIN happens, we have likely been disconnected
        // from the Wayland session; try to handle that the best we can.
        if (!flushDisplay())
        {
            wl_display_cancel_read(_glfw.wl.display);

            _GLFWwindow* window = _glfw.windowListHead;
            while (window)
            {
                _glfwInputWindowCloseRequest(window);
                window = window->next;
            }

            return;
        }

        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
        {
            wl_display_cancel_read(_glfw.wl.display);
            return;
        }

        if (fds[DISPLAY_FD].revents & POLLIN)
        {
            wl_display_read_events(_glfw.wl.display);
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                event = GLFW_TRUE;
        }
        else
            wl_display_cancel_read(_glfw.wl.display);

        if (fds[KEYREPEAT_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.keyRepeatTimerfd, &repeats, sizeof(repeats)) == 8)
            {
                for (uint64_t i = 0; i < repeats; i++)
                {
                    _glfwInputKey(_glfw.wl.keyboardFocus,
                                  translateKey(_glfw.wl.keyRepeatScancode),
                                  _glfw.wl.keyRepeatScancode,
                                  GLFW_PRESS,
                                  _glfw.wl.xkb.modifiers);
                    inputText(_glfw.wl.keyboardFocus, _glfw.wl.keyRepeatScancode);
                }

                event = GLFW_TRUE;
            }
        }

        if (fds[CURSOR_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.cursorTimerfd, &repeats, sizeof(repeats)) == 8)
                incrementCursorImage(_glfw.wl.pointerFocus);
        }

        if (fds[LIBDECOR_FD].revents & POLLIN)
        {
            if (libdecor_dispatch(_glfw.wl.libdecor.context, 0) > 0)
                event = GLFW_TRUE;
        }
    }
}